

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCorrelationMatrix.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactCorrelationMatrix::~CompactCorrelationMatrix
          (CompactCorrelationMatrix *this)

{
  pointer pdVar1;
  pointer puVar2;
  
  pdVar1 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->correlations_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  puVar2 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->j_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->i_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT CompactCorrelationMatrix {

  /* fields */
  int ndigit_;
  int nnn_;
  std::vector< unsigned int > i_;
  std::vector< unsigned int > j_;
  std::vector< double > correlations_;

  /* auxiliary functions */
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/readMatrixElements.hpp"
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/verifyUnsigned.hpp"
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/compact.hpp"
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/verifyDigits.hpp"
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/verifySize.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/ctor.hpp"

  /* methods */

  /**
   *  @brief Return the number of digits used for compacting
   */
  unsigned int NDIGIT() const { return this->ndigit_; }

  /**
   *  @brief Return the number of digits used for compacting
   */
  unsigned int numberDigits() const { return this->NDIGIT(); }

  /**
   *  @brief Return the order of the correlation matrix
   */
  unsigned int NNN() const { return this->nnn_; }

  /**
   *  @brief Return the order of the correlation matrix
   */
  unsigned int order() const { return this->NNN(); }

  /**
   *  @brief Return the i coordinates for which correlation values are
   *         available
   */
  auto I() const { return ranges::cpp20::views::all( this->i_ ); }

  /**
   *  @brief Return the j coordinates for which correlation values are
   *         available
   */
  auto J() const { return ranges::cpp20::views::all( this->j_ ); }

  /**
   *  @brief Return the correlation values
   */
  auto correlations() const {

    return ranges::cpp20::views::all( this->correlations_ );
  }

  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/NC.hpp"
  #include "ENDFtk/section/32/151/CompactCorrelationMatrix/src/print.hpp"
}